

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  ~IfcSpace((IfcSpace *)
            &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0x58);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}